

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void decompress_view(view_t *views,picnic_instance_t *pp,uint8_t *src,uint idx)

{
  uint uVar1;
  uint64_t uVar2;
  uint in_ECX;
  size_t in_RDX;
  long in_RSI;
  size_t in_RDI;
  uint i_1;
  uint i;
  uint width;
  uint view_round_size;
  view_t *v;
  bitstream_t bs;
  uint num_views;
  undefined4 local_48;
  undefined4 local_44;
  mzd_local_t *v_00;
  
  uVar1 = (uint)*(byte *)(in_RSI + 3);
  v_00 = (mzd_local_t *)0x0;
  if (*(char *)(in_RSI + 2) == '\n') {
    if (*(char *)(in_RSI + 2) == '\n') {
      for (local_48 = 0; local_48 < uVar1; local_48 = local_48 + 1) {
        uVar2 = uint64_from_bitstream_10((bitstream_t *)0x13fc83);
        *(uint64_t *)(in_RDI + (ulong)in_ECX * 8) = uVar2;
        in_RDI = in_RDI + 0x60;
      }
    }
  }
  else {
    for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
      mzd_from_bitstream((bitstream_t *)CONCAT44(in_ECX,uVar1),v_00,in_RDX,in_RDI);
      in_RDI = in_RDI + 0x60;
    }
  }
  return;
}

Assistant:

static void decompress_view(view_t* views, const picnic_instance_t* pp, const uint8_t* src,
                            const unsigned int idx) {
  const unsigned int num_views = pp->lowmc.r;

  bitstream_t bs;
  bs.buffer.r = src;
  bs.position = 0;

  view_t* v = &views[0];
#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_192_192_4) || defined(WITH_LOWMC_255_255_4)
  if (pp->lowmc.m != 10) {
    const unsigned int view_round_size = pp->lowmc.m * 3;
    const unsigned int width           = (pp->lowmc.n + 63) / 64;

    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      mzd_from_bitstream(&bs, &v->s[idx], width, view_round_size);
    }
    return;
  }
#endif
  // clang-format off
#if defined(WITH_LOWMC_128_128_20) || defined(WITH_LOWMC_192_192_30) || defined(WITH_LOWMC_256_256_38)
  // clang-format on
  if (pp->lowmc.m == 10) {
    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      v->t[idx] = uint64_from_bitstream_10(&bs);
    }
    return;
  }
#endif
  UNREACHABLE;
}